

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.c
# Opt level: O1

float glmc_aabb_radius(vec3 *box)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (*box)[1] - box[1][1];
  fVar1 = (*box)[0] - box[1][0];
  fVar2 = (*box)[2] - box[1][2];
  fVar1 = fVar2 * fVar2 + fVar3 * fVar3 + fVar1 * fVar1;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  return fVar1 * 0.5;
}

Assistant:

CGLM_EXPORT
float
glmc_aabb_radius(vec3 box[2]) {
  return glm_aabb_radius(box);
}